

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horz_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_be2d6c::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test
::TestBody(HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test *this)

{
  HorzSuperresQThreshEndToEndTest *in_stack_00000190;
  
  HorzSuperresQThreshEndToEndTest::DoTest(in_stack_00000190);
  return;
}

Assistant:

TEST_P(HorzSuperresQThreshEndToEndTest, HorzSuperresQThreshEndToEndPSNRTest) {
  DoTest();
}